

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

void pbrt::detail::
     stringPrintfRecursive<float_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,float_const&,bool_const&>
               (string *s,char *fmt,float *v,SpectrumTextureHandle *args,
               SpectrumTextureHandle *args_1,SpectrumTextureHandle *args_2,
               SpectrumTextureHandle *args_3,FloatTextureHandle *args_4,FloatTextureHandle *args_5,
               float *args_6,bool *args_7)

{
  _Alloc_hider _Var1;
  long *plVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  char *s_00;
  detail *this;
  char cVar7;
  string nextFmt;
  string str;
  char *fmt_local;
  long *local_1d8;
  long local_1c8 [2];
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar7 = (char)&nextFmt;
  lVar4 = std::__cxx11::string::find(cVar7,0x2a);
  lVar5 = std::__cxx11::string::find(cVar7,0x73);
  lVar6 = std::__cxx11::string::find(cVar7,100);
  if (lVar4 != -1) {
    s_00 = "Non-integral type provided for %* format.";
    iVar3 = 0xe8;
    goto LAB_0032b097;
  }
  this = (detail *)0x2cbdf0e;
  iVar3 = std::__cxx11::string::compare((char *)&nextFmt);
  if (iVar3 != 0) {
    this = (detail *)0x2815dc7;
    iVar3 = std::__cxx11::string::compare((char *)&nextFmt);
    _Var1 = nextFmt._M_dataplus;
    if (iVar3 != 0) {
      if (lVar6 != -1) {
        s_00 = "Non-integral type passed to %d format.";
        iVar3 = 0x104;
LAB_0032b097:
        LogFatal(Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
                 ,iVar3,s_00);
      }
      if (lVar5 == -1) {
        if (nextFmt._M_string_length == 0) {
          s_00 = "Excess values passed to Printf.";
          iVar3 = 0x10d;
          goto LAB_0032b097;
        }
        iVar3 = snprintf((char *)0x0,0,nextFmt._M_dataplus._M_p,(double)*v);
        local_1a8[0]._M_local_buf[0] = '\0';
        _ss = (pointer)local_1a8;
        std::__cxx11::string::resize((ulong)&ss,(char)(iVar3 + 1));
        snprintf(_ss,(long)(iVar3 + 1),_Var1._M_p,(double)*v);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)_ss);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_ss != local_1a8) {
          operator_delete(_ss,CONCAT71(local_1a8[0]._M_allocated_capacity._1_7_,
                                       local_1a8[0]._M_local_buf[0]) + 1);
        }
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        std::ostream::_M_insert<double>((double)*v);
        _Var1 = nextFmt._M_dataplus;
        std::__cxx11::stringbuf::str();
        plVar2 = local_1d8;
        iVar3 = snprintf((char *)0x0,0,_Var1._M_p,local_1d8);
        str._M_string_length = 0;
        str.field_2._M_local_buf[0] = '\0';
        str._M_dataplus._M_p = (pointer)&str.field_2;
        std::__cxx11::string::resize((ulong)&str,(char)(iVar3 + 1));
        snprintf(str._M_dataplus._M_p,(long)(iVar3 + 1),_Var1._M_p,plVar2);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)str._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != &str.field_2) {
          operator_delete(str._M_dataplus._M_p,
                          CONCAT71(str.field_2._M_allocated_capacity._1_7_,
                                   str.field_2._M_local_buf[0]) + 1);
        }
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
        std::ios_base::~ios_base(local_138);
      }
      goto LAB_0032b000;
    }
  }
  FloatToString_abi_cxx11_((string *)&ss,this,*v);
  std::__cxx11::string::_M_append((char *)s,(ulong)_ss);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_ss != local_1a8) {
    operator_delete(_ss,CONCAT71(local_1a8[0]._M_allocated_capacity._1_7_,
                                 local_1a8[0]._M_local_buf[0]) + 1);
  }
LAB_0032b000:
  stringPrintfRecursive<pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,float_const&,bool_const&>
            (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5,args_6,args_7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nextFmt._M_dataplus._M_p != &nextFmt.field_2) {
    operator_delete(nextFmt._M_dataplus._M_p,nextFmt.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}